

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool do_last_general(DisasContext_conflict1 *s,arg_rpr_esz *a,_Bool before)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  uintptr_t o;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    pTVar2 = do_last_scalar(s,a->esz,a->pg,a->rn,before);
    pTVar3 = cpu_reg_aarch64(s,a->rd);
    if (pTVar3 != pTVar2) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(pTVar3 + (long)tcg_ctx),
                          (TCGArg)(pTVar2 + (long)&tcg_ctx->pool_cur));
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool do_last_general(DisasContext *s, arg_rpr_esz *a, bool before)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 val = do_last_scalar(s, a->esz, a->pg, a->rn, before);
        tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, a->rd), val);
        tcg_temp_free_i64(tcg_ctx, val);
    }
    return true;
}